

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderInvarianceRule2Test::getTECode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderInvarianceRule2Test *this,
          uint n_iteration)

{
  _tessellation_shader_vertex_spacing *p_Var1;
  _tessellation_primitive_mode local_44;
  _tessellation_shader_vertex_spacing local_40;
  _tessellation_shader_vertex_ordering vertex_ordering;
  _tessellation_primitive_mode primitive_mode;
  bool point_mode;
  float outer_tess_levels [4];
  float inner_tess_levels [2];
  uint bo_size;
  uint n_iteration_local;
  TessellationShaderInvarianceRule2Test *this_local;
  
  inner_tess_levels[0] = 0.0;
  inner_tess_levels[1] = (float)n_iteration;
  memset(outer_tess_levels + 2,0,8);
  memset(&primitive_mode,0,0x10);
  vertex_ordering._3_1_ = TESSELLATION_SHADER_VERTEX_ORDERING_CCW >> 0x18;
  local_40 = TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT;
  local_44 = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
  p_Var1 = &local_40;
  (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
    super_TestNode._vptr_TestNode[0xb])
            (this,(ulong)(uint)inner_tess_levels[1],outer_tess_levels + 2,&primitive_mode,
             (byte *)((long)&vertex_ordering + 3),p_Var1,&local_44,inner_tess_levels);
  TessellationShaderUtils::getGenericTECode_abi_cxx11_
            (__return_storage_ptr__,(TessellationShaderUtils *)0x0,local_40,local_44,
             (uint)(byte)(vertex_ordering._3_1_ & 1),SUB81(p_Var1,0));
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderInvarianceRule2Test::getTECode(unsigned int n_iteration)
{
	unsigned int						 bo_size			  = 0;
	float								 inner_tess_levels[2] = { 0 };
	float								 outer_tess_levels[4] = { 0 };
	bool								 point_mode			  = false;
	_tessellation_primitive_mode		 primitive_mode		  = TESSELLATION_SHADER_PRIMITIVE_MODE_UNKNOWN;
	_tessellation_shader_vertex_ordering vertex_ordering	  = TESSELLATION_SHADER_VERTEX_ORDERING_UNKNOWN;

	getIterationProperties(n_iteration, inner_tess_levels, outer_tess_levels, &point_mode, &primitive_mode,
						   &vertex_ordering, &bo_size);

	return TessellationShaderUtils::getGenericTECode(TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, primitive_mode,
													 vertex_ordering, point_mode);
}